

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall cppforth::Forth::fileSize(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint handler;
  long lVar2;
  long lVar3;
  long lVar4;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string filename;
  long *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  path local_70;
  string local_48;
  
  requireDStackDepth(this,1,"FILE-SIZE");
  this_00 = &this->dStack;
  handler = ForthStack<unsigned_int>::getTop(this_00);
  paVar1 = &local_70._M_pathname.field_2;
  local_70._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"FILE-SIZE","");
  GetFileName(&local_48,this,handler,&local_70._M_pathname,errorFilePosition);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_pathname._M_dataplus._M_p,
                    local_70._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_70._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"FILE-SIZE","");
  GetFileHandle((Forth *)&local_80,(Cell)this,(string *)(ulong)handler,(errorCodes)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_pathname._M_dataplus._M_p,
                    local_70._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::ios::clear((int)local_80 + (int)*(undefined8 *)(*local_80 + -0x18));
  std::ostream::flush();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_70,&local_48,auto_format);
  lVar2 = std::filesystem::file_size(&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  lVar3 = std::istream::tellg();
  lVar4 = lVar2;
  if (lVar2 < lVar3) {
    lVar4 = lVar3;
  }
  ForthStack<unsigned_int>::setTop(this_00,0,(uint)lVar4);
  if (lVar2 < lVar3) {
    lVar2 = lVar3;
  }
  ForthStack<unsigned_int>::push(this_00,(uint)((ulong)lVar2 >> 0x20));
  ForthStack<unsigned_int>::push
            (this_00,-(*(uint *)((long)local_80 + *(long *)(*local_80 + -0x18) + 0x20) & 1) &
                     0xffffffbf);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void fileSize() {
	REQUIRE_DSTACK_DEPTH(1, "FILE-SIZE");
	auto h = (dStack.getTop());
	auto filename = GetFileName(h, "FILE-SIZE", errorFilePosition);
	auto f = GetFileHandle(h, "FILE-SIZE", errorFilePosition);
	f->clear();
	f->flush();
	auto filesize = std::filesystem::file_size(filename);
	DCell position(filesize);
	DCell currentPosition(f->tellg());
	if (currentPosition.data_.SDcells > position.data_.SDcells) {
		// if OS was not updated filesize of open file, we take biggest value
		position = currentPosition;
	}
	dStack.setTop(0, position.data_.Cells.lo);
	dStack.push(position.data_.Cells.hi);
	dStack.push(f->bad() ? Cell(errorFilePosition) : 0);
}